

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpp_api.c
# Opt level: O1

MPP_RET dci_hist_info_parser(RK_U8 *p_pack_hist_addr,RK_U32 *p_hist_local,RK_U32 *p_hist_global)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  MPP_RET MVar8;
  byte *pbVar9;
  ulong uVar10;
  long lVar11;
  
  if (p_hist_global == (RK_U32 *)0x0 ||
      (p_hist_local == (RK_U32 *)0x0 || p_pack_hist_addr == (RK_U8 *)0x0)) {
    _mpp_log_l(2,0,"found NULL ptr, pack_hist %p hist_local %p hist_global %p\n",
               "dci_hist_info_parser",p_pack_hist_addr,p_hist_local,p_hist_global);
    MVar8 = MPP_ERR_NULL_PTR;
  }
  else {
    pbVar9 = p_pack_hist_addr + 8;
    uVar10 = 0xfffffffffffffffc;
    do {
      bVar1 = pbVar9[-6];
      bVar2 = pbVar9[-5];
      bVar3 = pbVar9[-4];
      bVar4 = pbVar9[-3];
      bVar5 = pbVar9[-2];
      bVar6 = pbVar9[-1];
      bVar7 = *pbVar9;
      p_hist_local[uVar10 + 4] = (uint)pbVar9[-7] << 8 | (bVar1 & 3) << 0x10 | (uint)pbVar9[-8];
      p_hist_local[uVar10 + 5] = (uint)(bVar1 >> 2) | (uint)bVar2 << 6 | (bVar3 & 0xf) << 0xe;
      p_hist_local[uVar10 + 6] = (uint)(bVar3 >> 4) | (uint)bVar4 << 4 | (bVar5 & 0x3f) << 0xc;
      p_hist_local[uVar10 + 7] = (uint)(bVar5 >> 6) + (uint)bVar6 * 4 | (uint)bVar7 << 10;
      uVar10 = uVar10 + 4;
      pbVar9 = pbVar9 + 9;
    } while (uVar10 < 0xffc);
    MVar8 = MPP_OK;
    lVar11 = 0;
    do {
      p_hist_global[lVar11] = *(RK_U32 *)(p_pack_hist_addr + lVar11 * 4 + 0x2400);
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x100);
  }
  return MVar8;
}

Assistant:

MPP_RET dci_hist_info_parser(RK_U8* p_pack_hist_addr, RK_U32* p_hist_local, RK_U32* p_hist_global)
{
    RK_U32 hw_hist_idx = 0;
    RK_U32 idx;

    if (NULL == p_pack_hist_addr || NULL == p_hist_local || NULL == p_hist_global) {
        mpp_err_f("found NULL ptr, pack_hist %p hist_local %p hist_global %p\n",  p_pack_hist_addr, p_hist_local, p_hist_global);
        return MPP_ERR_NULL_PTR;
    }

    /* Hist packed (10240 byte) -> unpacked (local: 16 * 16 * 16 * U32 + global: 256 * U32) */
    for (idx = 0; idx < RKVOP_PQ_PREPROCESS_HIST_SIZE_VERI * RKVOP_PQ_PREPROCESS_HIST_SIZE_HORI * RKVOP_PQ_PREPROCESS_LOCAL_HIST_BIN_NUMS; idx = idx + 4) {
        RK_U32 tmp0_u18, tmp1_u18, tmp2_u18, tmp3_u18;
        RK_U32 tmp0_u8, tmp1_u8, tmp2_u8, tmp3_u8, tmp4_u8, tmp5_u8, tmp6_u8, tmp7_u8, tmp8_u8;

        tmp0_u8 = *(p_pack_hist_addr + hw_hist_idx + 0);
        tmp1_u8 = *(p_pack_hist_addr + hw_hist_idx + 1);
        tmp2_u8 = *(p_pack_hist_addr + hw_hist_idx + 2);
        tmp3_u8 = *(p_pack_hist_addr + hw_hist_idx + 3);
        tmp4_u8 = *(p_pack_hist_addr + hw_hist_idx + 4);
        tmp5_u8 = *(p_pack_hist_addr + hw_hist_idx + 5);
        tmp6_u8 = *(p_pack_hist_addr + hw_hist_idx + 6);
        tmp7_u8 = *(p_pack_hist_addr + hw_hist_idx + 7);
        tmp8_u8 = *(p_pack_hist_addr + hw_hist_idx + 8);

        tmp0_u18 = ((tmp2_u8 & ((1 << 2) - 1)) << 16) + (tmp1_u8 << 8) + tmp0_u8;
        tmp1_u18 = ((tmp4_u8 & ((1 << 4) - 1)) << 14) + (tmp3_u8 << 6) + (tmp2_u8 >> 2);
        tmp2_u18 = ((tmp6_u8 & ((1 << 6) - 1)) << 12) + (tmp5_u8 << 4) + (tmp4_u8 >> 4);
        tmp3_u18 = (tmp8_u8 << 10) + (tmp7_u8 << 2) + (tmp6_u8 >> 6);

        *(p_hist_local + idx + 0) = tmp0_u18;
        *(p_hist_local + idx + 1) = tmp1_u18;
        *(p_hist_local + idx + 2) = tmp2_u18;
        *(p_hist_local + idx + 3) = tmp3_u18;
        hw_hist_idx += 9;
    }

    for (idx = 0; idx < RKVOP_PQ_PREPROCESS_GLOBAL_HIST_BIN_NUMS; idx++) {
        RK_U32 tmp0_u8, tmp1_u8, tmp2_u8, tmp3_u8;
        RK_U32 tmp_u32;

        tmp0_u8 = *(p_pack_hist_addr + hw_hist_idx + 0);
        tmp1_u8 = *(p_pack_hist_addr + hw_hist_idx + 1);
        tmp2_u8 = *(p_pack_hist_addr + hw_hist_idx + 2);
        tmp3_u8 = *(p_pack_hist_addr + hw_hist_idx + 3);

        tmp_u32 = (tmp3_u8 << 24) + (tmp2_u8 << 16) + (tmp1_u8 << 8) + tmp0_u8;
        *(p_hist_global + idx + 0) = tmp_u32;
        hw_hist_idx += 4;
    }

    return MPP_OK;
}